

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetBytesDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((*(string **)(descriptor + 0x90))->_M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"pb::ByteString.Empty",(allocator *)&local_38);
  }
  else {
    StringToBase64(&local_58,*(string **)(descriptor + 0x90));
    std::operator+(&local_38,"pb::ByteString.FromBase64(\"",&local_58);
    std::operator+(__return_storage_ptr__,&local_38,"\")");
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetBytesDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "pb::ByteString.Empty";
    else
        return "pb::ByteString.FromBase64(\"" + StringToBase64(descriptor->default_value_string()) + "\")";
}